

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O1

void brk_00(void)

{
  uint uVar1;
  ubyte uVar2;
  ubyte uVar3;
  int iVar4;
  ulong uVar5;
  
  brk_f = '\x01';
  iVar4 = pc + 1;
  pc = (uint)iVar4;
  uVar1 = (uint)sp;
  RAM[(ulong)sp + 0x100] = (ubyte)((uint)iVar4 >> 8);
  sp = sp + 0xfe;
  RAM[(ulong)(uVar1 - 1 & 0xff) + 0x100] = (ubyte)iVar4;
  update_dyn_p();
  uVar5 = (ulong)sp;
  sp = sp + 0xff;
  RAM[uVar5 + 0x100] = dyn_p;
  intd_f = '\x01';
  uVar2 = getbyte(0xfffe);
  uVar3 = getbyte(0xffff);
  pc = CONCAT11(uVar3,uVar2);
  return;
}

Assistant:

void brk_00(void) {
    brk_f = 1;
    pc++;
    pushbyte(pc / 0x100);
    pushbyte(pc % 0x100);
    update_dyn_p();
    pushbyte(dyn_p);
    intd_f = 1;
    pc = getbyte(0xFFFE) + (0x100 * getbyte(0xFFFF));
}